

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O0

int SSL_CREDENTIAL_set1_signing_algorithm_prefs
              (SSL_CREDENTIAL *cred,uint16_t *prefs,size_t num_prefs)

{
  bool bVar1;
  Array<unsigned_short> *out;
  Span<const_unsigned_short> local_38;
  size_t local_28;
  size_t num_prefs_local;
  uint16_t *prefs_local;
  SSL_CREDENTIAL *cred_local;
  
  local_28 = num_prefs;
  num_prefs_local = (size_t)prefs;
  prefs_local = (uint16_t *)cred;
  bVar1 = ssl_credential_st::UsesPrivateKey(cred);
  if (bVar1) {
    if (*(int *)(prefs_local + 2) == 1) {
      ERR_put_error(0x10,0,0x42,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                    ,0x252);
      cred_local._4_4_ = 0;
    }
    else {
      out = (Array<unsigned_short> *)(prefs_local + 0x10);
      bssl::Span<const_unsigned_short>::Span(&local_38,(unsigned_short *)num_prefs_local,local_28);
      bVar1 = set_sigalg_prefs(out,local_38);
      cred_local._4_4_ = (uint)bVar1;
    }
  }
  else {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0x24b);
    cred_local._4_4_ = 0;
  }
  return cred_local._4_4_;
}

Assistant:

int SSL_CREDENTIAL_set1_signing_algorithm_prefs(SSL_CREDENTIAL *cred,
                                                const uint16_t *prefs,
                                                size_t num_prefs) {
  if (!cred->UsesPrivateKey()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  // Delegated credentials are constrained to a single algorithm, so there is no
  // need to configure this.
  if (cred->type == SSLCredentialType::kDelegated) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return 0;
  }

  return set_sigalg_prefs(&cred->sigalgs, Span(prefs, num_prefs));
}